

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<bool> __thiscall
cinatra::coro_http_client::timeout<coro_io::period_timer>
          (coro_http_client *this,period_timer *timer,duration duration,string *msg)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  element_type *peVar3;
  null_logger_t *this_00;
  undefined8 *extraout_RAX_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<bool,_false> in_RDI;
  shared_ptr<cinatra::coro_http_client::socket_t> socket;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  void *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int local_1c4;
  __shared_ptr local_d8 [22];
  undefined1 local_c2;
  byte local_c1;
  period_timer *in_stack_ffffffffffffff58;
  
  puVar2 = (undefined8 *)operator_new(0xa8,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<bool>::get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = timeout<coro_io::period_timer>;
    puVar2[1] = timeout<coro_io::period_timer>;
    puVar2[0x13] = in_RSI;
    puVar2[0xe] = in_RDX;
    puVar2[0xf] = in_RCX;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    async_simple::coro::detail::LazyPromise<bool>::LazyPromise
              ((LazyPromise<bool> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    async_simple::coro::detail::LazyPromise<bool>::get_return_object
              ((LazyPromise<bool> *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xa5));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xa5));
      std::weak_ptr<cinatra::coro_http_client::socket_t>::
      weak_ptr<cinatra::coro_http_client::socket_t,void>
                ((weak_ptr<cinatra::coro_http_client::socket_t> *)
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (shared_ptr<cinatra::coro_http_client::socket_t> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                       *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                      (duration *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      coro_io::period_timer::async_await(in_stack_ffffffffffffff58);
      async_simple::coro::detail::LazyPromiseBase::await_transform<async_simple::coro::Lazy<bool>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 (Lazy<bool> *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      bVar1 = async_simple::coro::detail::LazyAwaiterBase<bool>::await_ready
                        ((LazyAwaiterBase<bool> *)(puVar2 + 0x11));
      if (bVar1) {
        puVar2[0xd] = (LazyAwaiterBase<bool> *)(puVar2 + 0x11);
        local_c1 = async_simple::coro::detail::LazyAwaiterBase<bool>::awaitResume
                             ((LazyAwaiterBase<bool> *)
                              CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        async_simple::coro::detail::LazyBase<bool,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x2b88ac);
        async_simple::coro::Lazy<bool>::~Lazy((Lazy<bool> *)0x2b88b9);
        *(byte *)((long)puVar2 + 0xa6) = local_c1 & 1;
        if ((*(byte *)((long)puVar2 + 0xa6) & 1) == 0) {
          local_c2 = 0;
          async_simple::coro::detail::LazyPromise<bool>::return_value<bool>
                    ((LazyPromise<bool> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     (bool *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        }
        else {
          std::weak_ptr<cinatra::coro_http_client::socket_t>::lock
                    ((weak_ptr<cinatra::coro_http_client::socket_t> *)
                     CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          bVar1 = std::__shared_ptr::operator_cast_to_bool(local_d8);
          if (bVar1) {
            peVar3 = std::
                     __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x2b8977);
            peVar3->is_timeout_ = true;
            this_00 = null_logger_t::operator<<
                                ((null_logger_t *)&NULL_LOGGER,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(puVar2 + 7));
            null_logger_t::operator<<(this_00,(char (*) [9])" timeout");
            std::
            __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
            close_socket((socket_t *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
          }
          std::shared_ptr<cinatra::coro_http_client::socket_t>::~shared_ptr
                    ((shared_ptr<cinatra::coro_http_client::socket_t> *)0x2b89fc);
          async_simple::coro::detail::LazyPromise<bool>::return_value<bool>
                    ((LazyPromise<bool> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                     (bool *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        }
        local_1c4 = 3;
        std::weak_ptr<cinatra::coro_http_client::socket_t>::~weak_ptr
                  ((weak_ptr<cinatra::coro_http_client::socket_t> *)0x2b8a3f);
        if (local_1c4 == 3) {
          async_simple::coro::detail::LazyPromiseBase::final_suspend
                    ((LazyPromiseBase *)(puVar2 + 2));
          bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar2 + 0xa7));
          if (!bVar1) {
            *puVar2 = 0;
            *(undefined1 *)((long)puVar2 + 0xa4) = 2;
            timeout(in_stack_fffffffffffffe20,
                    (void *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<bool>)in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xa7));
          in_stack_fffffffffffffe14 = 0;
          in_stack_fffffffffffffe10 = 0;
        }
        async_simple::coro::detail::LazyPromise<bool>::~LazyPromise((LazyPromise<bool> *)0x2b8bb1);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0xa8);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0xa4) = 1;
        timeout((void *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                (void *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0xa4) = 0;
      timeout(in_stack_fffffffffffffe20,
              (void *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    }
  }
  return (Lazy<bool>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<bool> timeout(
      auto &timer, std::chrono::steady_clock::duration duration,
      std::string msg) {
    auto watcher = std::weak_ptr(socket_);
    timer.expires_after(duration);
    auto is_timeout = co_await timer.async_await();
    if (!is_timeout) {
      co_return false;
    }
    if (auto socket = watcher.lock(); socket) {
      socket_->is_timeout_ = true;
      CINATRA_LOG_WARNING << msg << " timeout";
      close_socket(*socket_);
    }
    co_return true;
  }